

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O1

Slice __thiscall leveldb::anon_unknown_3::TrimSpace(anon_unknown_3 *this,Slice s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  Slice SVar9;
  
  pcVar4 = s.data_;
  pcVar7 = (char *)0x0;
  pcVar8 = pcVar7;
  if (pcVar4 != (char *)0x0) {
    do {
      iVar1 = isspace((int)(char)this[(long)pcVar7]);
      pcVar8 = pcVar7;
      if (iVar1 == 0) break;
      pcVar7 = pcVar7 + 1;
      pcVar8 = pcVar4;
    } while (pcVar4 != pcVar7);
  }
  iVar5 = (int)s.data_;
  iVar6 = (int)pcVar8;
  iVar1 = iVar5;
  if (iVar6 < iVar5) {
    iVar1 = iVar6;
  }
  iVar3 = iVar5 + 1;
  pcVar7 = (char *)(long)iVar5;
  do {
    iVar5 = iVar1;
    if ((long)pcVar7 <= (long)iVar6) break;
    if (pcVar4 <= pcVar7 + -1) {
      __assert_fail("n < size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/include/leveldb/slice.h"
                    ,0x3a,"char leveldb::Slice::operator[](size_t) const");
    }
    iVar2 = isspace((int)(char)(this + -1)[(long)pcVar7]);
    iVar3 = iVar3 + -1;
    pcVar7 = pcVar7 + -1;
    iVar5 = iVar3;
  } while (iVar2 != 0);
  SVar9.size_ = (size_t)(iVar5 - iVar6);
  SVar9.data_ = (char *)(this + (long)pcVar8);
  return SVar9;
}

Assistant:

static Slice TrimSpace(Slice s) {
  int start = 0;
  while (start < s.size() && isspace(s[start])) {
    start++;
  }
  int limit = s.size();
  while (limit > start && isspace(s[limit - 1])) {
    limit--;
  }
  return Slice(s.data() + start, limit - start);
}